

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.cpp
# Opt level: O0

void TTD::LoadValuesForHashTables
               (uint32 targetSize,uint32 *powerOf2,uint32 *closePrime,uint32 *midPrime)

{
  uint32 *midPrime_local;
  uint32 *closePrime_local;
  uint32 *powerOf2_local;
  uint32 targetSize_local;
  
  if (targetSize < 0x80) {
    *powerOf2 = 0x80;
    *closePrime = 0x7f;
    *midPrime = 0x3d;
  }
  else if (targetSize < 0x100) {
    *powerOf2 = 0x100;
    *closePrime = 0xfb;
    *midPrime = 0x7f;
  }
  else if (targetSize < 0x200) {
    *powerOf2 = 0x200;
    *closePrime = 0x1ff;
    *midPrime = 0xfb;
  }
  else if (targetSize < 0x400) {
    *powerOf2 = 0x400;
    *closePrime = 0x3fd;
    *midPrime = 0x1ff;
  }
  else if (targetSize < 0x800) {
    *powerOf2 = 0x800;
    *closePrime = 0x7f7;
    *midPrime = 0x3fd;
  }
  else if (targetSize < 0x1000) {
    *powerOf2 = 0x1000;
    *closePrime = 0xffd;
    *midPrime = 0x7f7;
  }
  else if (targetSize < 0x2000) {
    *powerOf2 = 0x2000;
    *closePrime = 0x1fff;
    *midPrime = 0xffd;
  }
  else if (targetSize < 0x4000) {
    *powerOf2 = 0x4000;
    *closePrime = 0x3ffd;
    *midPrime = 0x1fff;
  }
  else if (targetSize < 0x8000) {
    *powerOf2 = 0x8000;
    *closePrime = 0x7fed;
    *midPrime = 0x3ffd;
  }
  else if (targetSize < 0x10000) {
    *powerOf2 = 0x10000;
    *closePrime = 0xfff1;
    *midPrime = 0x7fed;
  }
  else if (targetSize < 0x20000) {
    *powerOf2 = 0x20000;
    *closePrime = 0x1ffff;
    *midPrime = 0xfff1;
  }
  else if (targetSize < 0x40000) {
    *powerOf2 = 0x40000;
    *closePrime = 0x3fffb;
    *midPrime = 0x1ffff;
  }
  else if (targetSize < 0x80000) {
    *powerOf2 = 0x80000;
    *closePrime = 0x7ffff;
    *midPrime = 0x3fffb;
  }
  else if (targetSize < 0x100000) {
    *powerOf2 = 0x100000;
    *closePrime = 0xffffd;
    *midPrime = 0x7ffff;
  }
  else if (targetSize < 0x200000) {
    *powerOf2 = 0x200000;
    *closePrime = 0x1ffff7;
    *midPrime = 0xffffd;
  }
  else if (targetSize < 0x400000) {
    *powerOf2 = 0x400000;
    *closePrime = 0x3ffffd;
    *midPrime = 0x1ffff7;
  }
  else if (targetSize < 0x800000) {
    *powerOf2 = 0x800000;
    *closePrime = 0x7ffff1;
    *midPrime = 0x3ffffd;
  }
  else {
    *powerOf2 = 0x1000000;
    *closePrime = 0xfffffd;
    *midPrime = 0x7ffff1;
  }
  return;
}

Assistant:

void LoadValuesForHashTables(uint32 targetSize, uint32* powerOf2, uint32* closePrime, uint32* midPrime)
    {
        TTD_TABLE_FACTORLOAD_BASE(128, 127, 61)

            TTD_TABLE_FACTORLOAD(256, 251, 127)
            TTD_TABLE_FACTORLOAD(512, 511, 251)
            TTD_TABLE_FACTORLOAD(1024, 1021, 511)
            TTD_TABLE_FACTORLOAD(2048, 2039, 1021)
            TTD_TABLE_FACTORLOAD(4096, 4093, 2039)
            TTD_TABLE_FACTORLOAD(8192, 8191, 4093)
            TTD_TABLE_FACTORLOAD(16384, 16381, 8191)
            TTD_TABLE_FACTORLOAD(32768, 32749, 16381)
            TTD_TABLE_FACTORLOAD(65536, 65521, 32749)
            TTD_TABLE_FACTORLOAD(131072, 131071, 65521)
            TTD_TABLE_FACTORLOAD(262144, 262139, 131071)
            TTD_TABLE_FACTORLOAD(524288, 524287, 262139)
            TTD_TABLE_FACTORLOAD(1048576, 1048573, 524287)
            TTD_TABLE_FACTORLOAD(2097152, 2097143, 1048573)
            TTD_TABLE_FACTORLOAD(4194304, 4194301, 2097143)
            TTD_TABLE_FACTORLOAD(8388608, 8388593, 4194301)

        TTD_TABLE_FACTORLOAD_FINAL(16777216, 16777213, 8388593)
    }